

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshFileLoader.cpp
# Opt level: O2

void chrono::fea::ChMeshFileLoader::BSTShellFromObjFile
               (shared_ptr<chrono::fea::ChMesh> *mesh,char *filename,
               shared_ptr<chrono::fea::ChMaterialShellKirchhoff> *my_material,double my_thickness,
               ChVector<double> *pos_transform,ChMatrix33<double> *rot_transform)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pCVar6;
  ChMesh *pCVar7;
  pointer pCVar8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> node5_00;
  element_type *peVar9;
  element_type *peVar10;
  mapped_type *pmVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int vi;
  uint uVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe30;
  pair<int,_int> medge2;
  pair<int,_int> medge1;
  pair<int,_int> medge0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> node3;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode;
  double local_168;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  shapenodes;
  shared_ptr<chrono::fea::ChElementShellBST> melement;
  map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  winged_edges;
  shared_ptr<chrono::fea::ChNodeFEAxyz> node5;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> mmesh;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__cxx11::string::string((string *)&winged_edges,filename,(allocator *)&shapenodes);
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)&mmesh,(string *)&winged_edges,false,false);
  std::__cxx11::string::~string((string *)&winged_edges);
  peVar10 = mmesh.
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  winged_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &winged_edges._M_t._M_impl.super__Rb_tree_header._M_header;
  winged_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  winged_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  winged_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  winged_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       winged_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  geometry::ChTriangleMeshConnected::ComputeWingedEdges
            (mmesh.
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&winged_edges,true);
  shapenodes.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapenodes.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shapenodes.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar14 = 0x10;
  uVar15 = 0;
  while( true ) {
    pCVar6 = ((mmesh.
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)((mmesh.
                         super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_vertices).
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar6) / 0x18) <= uVar15)
    break;
    node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)((long)pCVar6->m_data + lVar14 + -0x10);
    node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pCVar6->m_data + lVar14 + -8);
    ChMatrix33<double>::operator*(rot_transform,(ChVector<double> *)&node3);
    node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((double)mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + pos_transform->m_data[0]);
    node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi + pos_transform->m_data[1]);
    dVar1 = pos_transform->m_data[2];
    std::make_shared<chrono::fea::ChNodeFEAxyz>();
    if ((ChVector<double> *)
        &((mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_ChNodeFEAbase).field_0x20 != (ChVector<double> *)&node3) {
      *(element_type **)
       &((mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChNodeFEAbase).field_0x20 =
           node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       &(mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        field_0x28 = node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      *(double *)
       &(mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        field_0x30 = local_168 + dVar1;
    }
    pCVar7 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
              (local_40,&mnode.
                         super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    ChMesh::AddNode(pCVar7,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
    ::push_back(&shapenodes,
                (value_type *)
                &mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar15 = uVar15 + 1;
    lVar14 = lVar14 + 0x18;
  }
  uVar15 = 0;
  while( true ) {
    pCVar8 = (peVar10->m_face_v_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(peVar10->m_face_v_indices).
                       super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8) / 0xc) <= uVar15)
    break;
    iVar2 = pCVar8[uVar15].m_data[0];
    iVar3 = pCVar8[uVar15].m_data[1];
    iVar4 = pCVar8[uVar15].m_data[2];
    medge0.second = iVar4;
    medge0.first = iVar3;
    if (iVar4 < iVar3) {
      medge0.second = iVar3;
      medge0.first = iVar4;
    }
    medge1.first = iVar4;
    medge1.second = iVar2;
    if (iVar2 < iVar4) {
      medge1.first = iVar2;
      medge1.second = iVar4;
    }
    medge2.first = iVar2;
    medge2.second = iVar3;
    if (medge0.second < medge0.first) {
      medge2.first = iVar3;
      medge2.second = iVar2;
    }
    node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    node5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    node5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pmVar11 = std::
              map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::operator[](&winged_edges,&medge0);
    if (uVar15 == (long)pmVar11->second) {
      pmVar11 = std::
                map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::operator[](&winged_edges,&medge0);
    }
    else {
      pmVar11 = std::
                map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::operator[](&winged_edges,&medge0);
      pmVar11 = (mapped_type *)&pmVar11->second;
    }
    iVar5 = pmVar11->first;
    iVar13 = -1;
    for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
      piVar12 = ChVector<int>::operator[]
                          ((peVar10->m_face_v_indices).
                           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar5,uVar16);
      if (*piVar12 != medge0.first) {
        piVar12 = ChVector<int>::operator[]
                            ((peVar10->m_face_v_indices).
                             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar5,uVar16);
        if (*piVar12 != medge0.second) {
          piVar12 = ChVector<int>::operator[]
                              ((peVar10->m_face_v_indices).
                               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar5,uVar16);
          iVar13 = *piVar12;
        }
      }
    }
    if (iVar13 != -1) {
      std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                 &shapenodes.
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar13].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    }
    pmVar11 = std::
              map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::operator[](&winged_edges,&medge1);
    if (uVar15 == (long)pmVar11->second) {
      pmVar11 = std::
                map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::operator[](&winged_edges,&medge1);
    }
    else {
      pmVar11 = std::
                map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::operator[](&winged_edges,&medge1);
      pmVar11 = (mapped_type *)&pmVar11->second;
    }
    iVar5 = pmVar11->first;
    iVar13 = -1;
    for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
      piVar12 = ChVector<int>::operator[]
                          ((peVar10->m_face_v_indices).
                           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar5,uVar16);
      if (*piVar12 != medge1.first) {
        piVar12 = ChVector<int>::operator[]
                            ((peVar10->m_face_v_indices).
                             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar5,uVar16);
        if (*piVar12 != medge1.second) {
          piVar12 = ChVector<int>::operator[]
                              ((peVar10->m_face_v_indices).
                               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar5,uVar16);
          iVar13 = *piVar12;
        }
      }
    }
    if (iVar13 != -1) {
      std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                 &shapenodes.
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar13].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    }
    pmVar11 = std::
              map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::operator[](&winged_edges,&medge2);
    if (uVar15 == (long)pmVar11->second) {
      pmVar11 = std::
                map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::operator[](&winged_edges,&medge2);
    }
    else {
      pmVar11 = std::
                map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::operator[](&winged_edges,&medge2);
      pmVar11 = (mapped_type *)&pmVar11->second;
    }
    iVar5 = pmVar11->first;
    iVar13 = -1;
    for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
      piVar12 = ChVector<int>::operator[]
                          ((peVar10->m_face_v_indices).
                           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar5,uVar16);
      if (*piVar12 != medge2.first) {
        piVar12 = ChVector<int>::operator[]
                            ((peVar10->m_face_v_indices).
                             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar5,uVar16);
        if (*piVar12 != medge2.second) {
          piVar12 = ChVector<int>::operator[]
                              ((peVar10->m_face_v_indices).
                               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar5,uVar16);
          iVar13 = *piVar12;
        }
      }
    }
    if (iVar13 != -1) {
      std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&node5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                 &shapenodes.
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar13].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    }
    chrono_types::make_shared<chrono::fea::ChElementShellBST,_0>();
    peVar9 = melement.super___shared_ptr<chrono::fea::ChElementShellBST,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b0,
               &shapenodes.
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar2].
                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,
               &shapenodes.
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar3].
                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &shapenodes.
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar4].
                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               &node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
               (local_80 + 0x10),
               &mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)local_80,
               &node5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    node5_00.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = in_stack_fffffffffffffe30._M_pi;
    node5_00.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_80;
    ChElementShellBST::SetNodes
              (peVar9,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)&local_b0,
               (shared_ptr<chrono::fea::ChNodeFEAxyz> *)&local_c0,
               (shared_ptr<chrono::fea::ChNodeFEAxyz> *)&local_50,
               (shared_ptr<chrono::fea::ChNodeFEAxyz> *)&local_60,
               (shared_ptr<chrono::fea::ChNodeFEAxyz> *)(local_80 + 0x10),node5_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    pCVar7 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChElementShellBST,void>
              (local_90,&melement.
                         super___shared_ptr<chrono::fea::ChElementShellBST,_(__gnu_cxx::_Lock_policy)2>
              );
    ChMesh::AddElement(pCVar7,(shared_ptr<chrono::fea::ChElementBase> *)local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
    peVar9 = melement.super___shared_ptr<chrono::fea::ChElementShellBST,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::__shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_a0,
                 &my_material->
                  super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>
                );
    ChElementShellBST::AddLayer
              (peVar9,my_thickness,0.0,
               (shared_ptr<chrono::fea::ChMaterialShellKirchhoff> *)&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&melement.
                super___shared_ptr<chrono::fea::ChElementShellBST,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&node5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&node3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar15 = uVar15 + 1;
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::~vector(&shapenodes);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree(&winged_edges._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmesh.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void ChMeshFileLoader::BSTShellFromObjFile(
    std::shared_ptr<ChMesh> mesh,                           // destination mesh
    const char* filename,                                   // .obj mesh complete filename
    std::shared_ptr<ChMaterialShellKirchhoff> my_material,  // material to be given to the shell elements
    double my_thickness,                                    // thickness to be given to shell elements
    ChVector<> pos_transform,                               // optional displacement of imported mesh
    ChMatrix33<> rot_transform                              // optional rotation/scaling of imported mesh
) {
    auto mmesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(std::string(filename), false, false);
    const auto& v_indices = mmesh->m_face_v_indices;

    std::map<std::pair<int, int>, std::pair<int, int>> winged_edges;
    mmesh->ComputeWingedEdges(winged_edges);

    std::vector<std::shared_ptr<ChNodeFEAxyz>> shapenodes;
    for (size_t i = 0; i < mmesh->m_vertices.size(); i++) {
        ChVector<double> pos = mmesh->m_vertices[i];
        pos = rot_transform * pos;
        pos += pos_transform;
        auto mnode = chrono_types::make_shared<ChNodeFEAxyz>();
        mnode->SetPos(pos);
        mesh->AddNode(mnode);
        shapenodes.push_back(mnode);  // for future reference when adding faces
    }

    for (size_t j = 0; j < v_indices.size(); j++) {
        int i0 = v_indices[j][0];
        int i1 = v_indices[j][1];
        int i2 = v_indices[j][2];
        // GetLog() << "nodes 012 ids= " << i0 << " " << i1 << " " << i2 << " " << "\n";

        std::pair<int, int> medge0(i1, i2);
        std::pair<int, int> medge1(i2, i0);
        std::pair<int, int> medge2(i0, i1);
        if (medge0.first > medge0.second)
            medge0 = std::pair<int, int>(medge0.second, medge0.first);
        if (medge1.first > medge1.second)
            medge1 = std::pair<int, int>(medge1.second, medge1.first);
        if (medge0.first > medge0.second)
            medge2 = std::pair<int, int>(medge2.second, medge2.first);
        std::shared_ptr<ChNodeFEAxyz> node3 = nullptr;
        std::shared_ptr<ChNodeFEAxyz> node4 = nullptr;
        std::shared_ptr<ChNodeFEAxyz> node5 = nullptr;
        int itri = -1;
        int ivert = -1;
        if (winged_edges[medge0].second == j)
            itri = winged_edges[medge0].first;
        else
            itri = winged_edges[medge0].second;
        for (int vi = 0; vi < 3; ++vi) {
            if (v_indices[itri][vi] != medge0.first && v_indices[itri][vi] != medge0.second)
                ivert = v_indices[itri][vi];
        }
        if (ivert != -1)
            node3 = shapenodes[ivert];

        itri = -1;
        ivert = -1;
        if (winged_edges[medge1].second == j)
            itri = winged_edges[medge1].first;
        else
            itri = winged_edges[medge1].second;
        for (int vi = 0; vi < 3; ++vi) {
            if (v_indices[itri][vi] != medge1.first && v_indices[itri][vi] != medge1.second)
                ivert = v_indices[itri][vi];
        }
        if (ivert != -1)
            node4 = shapenodes[ivert];

        itri = -1;
        ivert = -1;
        if (winged_edges[medge2].second == j)
            itri = winged_edges[medge2].first;
        else
            itri = winged_edges[medge2].second;
        for (int vi = 0; vi < 3; ++vi) {
            if (v_indices[itri][vi] != medge2.first && v_indices[itri][vi] != medge2.second)
                ivert = v_indices[itri][vi];
        }
        if (ivert != -1)
            node5 = shapenodes[ivert];

        auto melement = chrono_types::make_shared<ChElementShellBST>();
        melement->SetNodes(shapenodes[i0], shapenodes[i1], shapenodes[i2], node3, node4, node5);
        mesh->AddElement(melement);
        melement->AddLayer(my_thickness, 0, my_material);
    }
}